

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O1

void __thiscall cppforth::Forth::executeDefinition(Forth *this,Definition *definition)

{
  Xt XVar1;
  ostream *poVar2;
  code *pcVar3;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  size_type *local_60;
  size_type local_58;
  size_type local_50;
  undefined8 uStack_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  XVar1 = this->executingWord;
  this->executingWord = definition->numberInVector;
  if (definition->code != 0) {
    if (this->traceCalls == true) {
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(definition->name)._M_dataplus._M_p,
                          (definition->name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    }
    pcVar3 = (code *)definition->code;
    if (((ulong)pcVar3 & 1) != 0) {
      pcVar3 = *(code **)(pcVar3 + *(long *)((long)&this->CellSize + *(long *)&definition->field_0x8
                                            ) + -1);
    }
    (*pcVar3)();
    this->executingWord = XVar1;
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_40,"Word \"",&definition->name);
  pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_40,"\" has nullptr code");
  local_60 = (size_type *)(pbVar4->_M_dataplus)._M_p;
  paVar5 = &pbVar4->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60 == paVar5) {
    local_50 = paVar5->_M_allocated_capacity;
    uStack_48 = *(undefined8 *)((long)&pbVar4->field_2 + 8);
    local_60 = &local_50;
  }
  else {
    local_50 = paVar5->_M_allocated_capacity;
  }
  local_58 = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
  pbVar4->_M_string_length = 0;
  (pbVar4->field_2)._M_local_buf[0] = '\0';
  std::runtime_error::runtime_error(this_00,(string *)&local_60);
  *(undefined ***)this_00 = &PTR__runtime_error_001434b8;
  __cxa_throw(this_00,&AbortException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void executeDefinition(struct Definition definition) {
				auto saved = executingWord;
				executingWord = definition.numberInVector;
				if (definition.code) {
					if (isTraceCalls()) {
						
						std::cout << definition.name << " ";
						// int i = forth_depth();
						// std::cerr << definition.name << " " << forth_depth();
						// while (i > 0) std::cerr << " " << forth_tocell(i--  - 1);
						// std::cerr<< std::endl;
					}
					((*this).*(definition.code))();
				}
				else {
					throw AbortException("Word \""+definition.name+"\" has nullptr code");
				}
				executingWord = saved;
			}